

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcfour.c
# Opt level: O0

void arcfour_block(void *handle,void *vblk,int len)

{
  undefined1 uVar1;
  uchar *s;
  uchar j;
  uchar i;
  uchar tmp;
  uint k;
  ArcfourContext *ctx;
  uchar *blk;
  int len_local;
  void *vblk_local;
  void *handle_local;
  
  s._2_1_ = *handle;
  s._1_1_ = *(byte *)((long)handle + 1);
  for (s._4_4_ = 0; (int)s._4_4_ < len; s._4_4_ = s._4_4_ + 1) {
    s._2_1_ = s._2_1_ + 1;
    s._1_1_ = s._1_1_ + *(char *)((long)handle + (ulong)s._2_1_ + 2);
    uVar1 = *(undefined1 *)((long)handle + (ulong)s._2_1_ + 2);
    *(undefined1 *)((long)handle + (ulong)s._2_1_ + 2) =
         *(undefined1 *)((long)handle + (ulong)s._1_1_ + 2);
    *(undefined1 *)((long)handle + (ulong)s._1_1_ + 2) = uVar1;
    *(byte *)((long)vblk + (ulong)s._4_4_) =
         *(byte *)((long)vblk + (ulong)s._4_4_) ^
         *(byte *)((long)handle +
                  (long)(int)((uint)*(byte *)((long)handle + (ulong)s._2_1_ + 2) +
                              (uint)*(byte *)((long)handle + (ulong)s._1_1_ + 2) & 0xff) + 2);
  }
  *(byte *)handle = s._2_1_;
  *(byte *)((long)handle + 1) = s._1_1_;
  return;
}

Assistant:

static void arcfour_block(void *handle, void *vblk, int len)
{
    unsigned char *blk = (unsigned char *)vblk;
    ArcfourContext *ctx = (ArcfourContext *)handle;
    unsigned k;
    unsigned char tmp, i, j, *s;

    s = ctx->s;
    i = ctx->i; j = ctx->j;
    for (k = 0; (int)k < len; k++) {
        i  = (i + 1) & 0xff;
        j  = (j + s[i]) & 0xff;
        tmp = s[i]; s[i] = s[j]; s[j] = tmp;
        blk[k] ^= s[(s[i]+s[j]) & 0xff];
    }
    ctx->i = i; ctx->j = j;
}